

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_floor(lua_State *L)

{
  int iVar1;
  lua_Number __x;
  double d_00;
  lua_Number d;
  lua_State *L_local;
  
  iVar1 = lua_isinteger(L,1);
  if (iVar1 == 0) {
    __x = luaL_checknumber(L,1);
    d_00 = floor(__x);
    pushnumint(L,d_00);
  }
  else {
    lua_settop(L,1);
  }
  return 1;
}

Assistant:

static int math_floor(lua_State *L) {
    if (lua_isinteger(L, 1))
        lua_settop(L, 1);  /* integer is its own floor */
    else {
        lua_Number d = l_mathop(floor)(luaL_checknumber(L, 1));
        pushnumint(L, d);
    }
    return 1;
}